

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<unsigned_int> __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_int>::tryAllocate
          (HoleSet<unsigned_int> *this,uint lgSize)

{
  size_t sVar1;
  NullableValue<unsigned_int> *other;
  uint *puVar2;
  uint in_EDX;
  undefined4 in_register_00000034;
  uint (*arr) [6];
  uint local_54;
  uint *puStack_50;
  uint result_1;
  uint *next;
  undefined1 local_34 [8];
  NullableValue<unsigned_int> local_2c;
  NullableValue<unsigned_int> _next90;
  uint result;
  uint lgSize_local;
  HoleSet<unsigned_int> *this_local;
  
  arr = (uint (*) [6])CONCAT44(in_register_00000034,lgSize);
  sVar1 = kj::size<unsigned_int,6ul>(arr);
  if (in_EDX < sVar1) {
    if ((*arr)[in_EDX] == 0) {
      tryAllocate((HoleSet<unsigned_int> *)local_34,lgSize);
      other = kj::_::readMaybe<unsigned_int>((Maybe<unsigned_int> *)local_34);
      kj::_::NullableValue<unsigned_int>::NullableValue
                ((NullableValue<unsigned_int> *)(local_34 + 8),other);
      kj::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_34);
      puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_int_((NullableValue *)(local_34 + 8))
      ;
      if (puVar2 == (uint *)0x0) {
        kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this);
      }
      else {
        puStack_50 = kj::_::NullableValue<unsigned_int>::operator*
                               ((NullableValue<unsigned_int> *)(local_34 + 8));
        local_54 = *puStack_50 * 2;
        (*arr)[in_EDX] = local_54 + 1;
        kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,&local_54);
      }
      kj::_::NullableValue<unsigned_int>::~NullableValue
                ((NullableValue<unsigned_int> *)(local_34 + 8));
    }
    else {
      _next90._0_4_ = (*arr)[in_EDX];
      (*arr)[in_EDX] = 0;
      kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(uint *)&_next90);
    }
  }
  else {
    kj::Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this);
  }
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

kj::Maybe<UIntType> tryAllocate(UIntType lgSize) {
      // Try to find space for a field of size 2^lgSize within the set of holes.  If found,
      // remove it from the holes, and return its offset (as a multiple of its size).  If there
      // is no such space, returns zero (no hole can be at offset zero, as explained above).

      if (lgSize >= kj::size(holes)) {
        return kj::none;
      } else if (holes[lgSize] != 0) {
        UIntType result = holes[lgSize];
        holes[lgSize] = 0;
        return result;
      } else {
        KJ_IF_SOME(next, tryAllocate(lgSize + 1)) {
          UIntType result = next * 2;
          holes[lgSize] = result + 1;
          return result;
        } else {
          return kj::none;
        }
      }